

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O0

void __thiscall
ut::registry::add_test<agge::tests::TextEngineRichTextTests>
          (registry *this,offset_in_TextEngineRichTextTests_to_subr method,char *name)

{
  test_case_impl<agge::tests::TextEngineRichTextTests> *ptVar1;
  char *pcVar2;
  char *in_RCX;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  value_type local_150;
  _Base_ptr local_140;
  undefined1 local_138;
  immutable_basic_string<char> local_130;
  allocator local_119;
  immutable_basic_string<char> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  _Base_ptr local_c8;
  undefined1 local_c0;
  undefined1 local_b1;
  offset_in_TextEngineRichTextTests_to_subr local_b0;
  char *local_a8;
  shared_ptr<ut::setup_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> local_a0;
  allocator local_89;
  shared_ptr<ut::setup_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> local_88 [3];
  undefined1 local_58 [8];
  shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> tc;
  shared_ptr<ut::setup_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> setup;
  char *name_local;
  offset_in_TextEngineRichTextTests_to_subr method_local;
  registry *this_local;
  
  get_setup<agge::tests::TextEngineRichTextTests>((registry *)&tc._refcount);
  ptVar1 = (test_case_impl<agge::tests::TextEngineRichTextTests> *)operator_new(0x38);
  local_b1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_88,in_RCX,&local_89);
  shared_ptr<ut::setup_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>::shared_ptr
            (&local_a0,
             (shared_ptr<ut::setup_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> *)
             &tc._refcount);
  local_b0 = method;
  local_a8 = name;
  test_case_impl<agge::tests::TextEngineRichTextTests>::test_case_impl
            (ptVar1,method,(string *)name,local_88);
  local_b1 = 0;
  shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>::shared_ptr
            ((shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> *)
             local_58,ptVar1);
  shared_ptr<ut::setup_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>::~shared_ptr
            (&local_a0);
  std::__cxx11::string::~string((string *)local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  ptVar1 = shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>::
           operator->((shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>
                       *)local_58);
  (*(ptVar1->super_test_case).super_destructible._vptr_destructible[2])(&local_118);
  pcVar2 = exportable::immutable_basic_string<char>::c_str(&local_118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,pcVar2,&local_119);
  ptVar1 = shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>::
           operator->((shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>
                       *)local_58);
  (*(ptVar1->super_test_case).super_destructible._vptr_destructible[3])(&local_130);
  pcVar2 = exportable::immutable_basic_string<char>::c_str(&local_130);
  std::operator+(&local_e8,&local_108,pcVar2);
  pVar3 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->_registered_names,&local_e8);
  local_140 = (_Base_ptr)pVar3.first._M_node;
  local_138 = pVar3.second;
  local_c8 = local_140;
  local_c0 = local_138;
  std::__cxx11::string::~string((string *)&local_e8);
  exportable::immutable_basic_string<char>::~immutable_basic_string(&local_130);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  exportable::immutable_basic_string<char>::~immutable_basic_string(&local_118);
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    shared_ptr<ut::test_case,unsigned_int>::
    shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>>
              ((shared_ptr<ut::test_case,unsigned_int> *)&local_150,
               (shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> *
               )local_58);
    std::
    vector<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
    ::push_back(&this->_test_cases,&local_150);
    shared_ptr<ut::test_case,_unsigned_int>::~shared_ptr(&local_150);
  }
  shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>::~shared_ptr
            ((shared_ptr<ut::test_case_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> *)
             local_58);
  shared_ptr<ut::setup_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int>::~shared_ptr
            ((shared_ptr<ut::setup_impl<agge::tests::TextEngineRichTextTests>,_unsigned_int> *)
             &tc._refcount);
  return;
}

Assistant:

inline void registry::add_test(void (FixtureT::*method)(), const char *name)
	{
		typedef test_case_impl<FixtureT> test_case;
		typedef setup_impl<FixtureT> fixture_setup;

		shared_ptr<fixture_setup> setup(get_setup<FixtureT>());
		shared_ptr<test_case> tc(new test_case_impl<FixtureT>(method, name, setup));

		if (_registered_names.insert(std::string(tc->fixture_name().c_str()) + tc->name().c_str()).second)
			_test_cases.push_back(tc);
	}